

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParser.cpp
# Opt level: O2

void __thiscall AutoArgParse::FlagStore::printUsageSummary(FlagStore *this,ostream *os)

{
  pointer puVar1;
  _Elt_pointer pbVar2;
  int iVar3;
  mapped_type *pmVar4;
  unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_> *argPtr;
  pointer puVar5;
  ArgBase *pAVar6;
  FlagBase *pFVar7;
  _Elt_pointer pbVar8;
  _Map_pointer ppbVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *flag;
  _Elt_pointer __k;
  
  puVar1 = (this->args).
           super__Vector_base<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar5 = (this->args).
                super__Vector_base<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
    std::operator<<(os," ");
    pAVar6 = (puVar5->_M_t).
             super___uniq_ptr_impl<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>
             ._M_t.
             super__Tuple_impl<0UL,_AutoArgParse::ArgBase_*,_std::default_delete<AutoArgParse::ArgBase>_>
             .super__Head_base<0UL,_AutoArgParse::ArgBase_*,_false>._M_head_impl;
    if ((pAVar6->super_ParseToken).policy == OPTIONAL) {
      std::operator<<(os,"[");
      pAVar6 = (puVar5->_M_t).
               super___uniq_ptr_impl<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_AutoArgParse::ArgBase_*,_std::default_delete<AutoArgParse::ArgBase>_>
               .super__Head_base<0UL,_AutoArgParse::ArgBase_*,_false>._M_head_impl;
    }
    std::operator<<(os,(string *)&pAVar6->name);
    if ((((puVar5->_M_t).
          super___uniq_ptr_impl<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>.
          _M_t.
          super__Tuple_impl<0UL,_AutoArgParse::ArgBase_*,_std::default_delete<AutoArgParse::ArgBase>_>
          .super__Head_base<0UL,_AutoArgParse::ArgBase_*,_false>._M_head_impl)->super_ParseToken).
        policy == OPTIONAL) {
      std::operator<<(os,"]");
    }
  }
  __k = (this->flagInsertionOrder).
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pbVar8 = (this->flagInsertionOrder).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  ppbVar9 = (this->flagInsertionOrder).
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  pbVar2 = (this->flagInsertionOrder).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  while (__k != pbVar2) {
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)&this->flags,__k);
    std::operator<<(os," ");
    pFVar7 = (pmVar4->_M_t).
             super___uniq_ptr_impl<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>
             ._M_t.
             super__Tuple_impl<0UL,_AutoArgParse::FlagBase_*,_std::default_delete<AutoArgParse::FlagBase>_>
             .super__Head_base<0UL,_AutoArgParse::FlagBase_*,_false>._M_head_impl;
    if ((pFVar7->super_ParseToken).policy == OPTIONAL) {
      std::operator<<(os,"[");
      pFVar7 = (pmVar4->_M_t).
               super___uniq_ptr_impl<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_AutoArgParse::FlagBase_*,_std::default_delete<AutoArgParse::FlagBase>_>
               .super__Head_base<0UL,_AutoArgParse::FlagBase_*,_false>._M_head_impl;
    }
    iVar3 = (*(pFVar7->super_ParseToken)._vptr_ParseToken[5])();
    if ((char)iVar3 == '\0') {
      std::operator<<(os,(string *)__k);
    }
    pFVar7 = (pmVar4->_M_t).
             super___uniq_ptr_impl<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>
             ._M_t.
             super__Tuple_impl<0UL,_AutoArgParse::FlagBase_*,_std::default_delete<AutoArgParse::FlagBase>_>
             .super__Head_base<0UL,_AutoArgParse::FlagBase_*,_false>._M_head_impl;
    (**(code **)((long)(pFVar7->super_ParseToken)._vptr_ParseToken + 0x20))(pFVar7,os);
    if ((((pmVar4->_M_t).
          super___uniq_ptr_impl<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_AutoArgParse::FlagBase_*,_std::default_delete<AutoArgParse::FlagBase>_>
          .super__Head_base<0UL,_AutoArgParse::FlagBase_*,_false>._M_head_impl)->super_ParseToken).
        policy == OPTIONAL) {
      std::operator<<(os,"]");
    }
    __k = __k + 1;
    if (__k == pbVar8) {
      __k = ppbVar9[1];
      ppbVar9 = ppbVar9 + 1;
      pbVar8 = __k + 0x10;
    }
  }
  return;
}

Assistant:

AUTOARGPARSE_INLINE void FlagStore::printUsageSummary(std::ostream& os) const {
    for (auto& argPtr : args) {
        os << " ";
        if (argPtr->policy == Policy::OPTIONAL) {
            os << "[";
        }
        os << argPtr->name;
        if (argPtr->policy == Policy::OPTIONAL) {
            os << "]";
        }
    }
    for (const auto& flag : flagInsertionOrder) {
        auto& flagObj = flags.at(flag);
        os << " ";

        if (flagObj->policy == Policy::OPTIONAL) {
            os << "[";
        }
        if (!flagObj->isExclusiveGroup()) {
            os << flag;
        }
        flagObj->printUsageSummary(os);
        if (flagObj->policy == Policy::OPTIONAL) {
            os << "]";
        }
    }
}